

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O2

void __thiscall CNet::Refine(CNet *this)

{
  pointer ppCVar1;
  CWire *pCVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  pointer ppCVar7;
  int i;
  long lVar8;
  longlong S;
  longlong E;
  iterator local_68;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  RedPoint;
  
  if (((this->super_CObject).m_iProp & 1) == 0) {
    iVar4 = IsRouted(this);
    if (iVar4 != 0) {
      SplitWire(this);
      __gnu_cxx::
      hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
      ::hash_map(&RedPoint);
      ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar7 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppCVar7 != ppCVar1; ppCVar7 = ppCVar7 + 1) {
        pCVar2 = *ppCVar7;
        S = (longlong)((uint)(pCVar2->m_pPointS->super_CObject).m_Key & 0xffffff00);
        piVar6 = __gnu_cxx::
                 hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::operator[](&RedPoint,&S);
        *piVar6 = *piVar6 + 1;
        S = (longlong)((uint)(pCVar2->m_pPointE->super_CObject).m_Key & 0xffffff00);
        piVar6 = __gnu_cxx::
                 hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::operator[](&RedPoint,&S);
        *piVar6 = *piVar6 + 1;
      }
      for (lVar8 = 0; lVar8 < this->m_iNumPin; lVar8 = lVar8 + 1) {
        S = (longlong)((uint)(this->m_ppPin[lVar8]->super_CPoint).super_CObject.m_Key & 0xffffff00);
        __gnu_cxx::
        hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
        ::erase(&RedPoint._M_ht,&S);
      }
      local_68 = __gnu_cxx::
                 hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::begin(&RedPoint._M_ht);
      while (local_68._M_cur != (_Node *)0x0) {
        if (((local_68._M_cur)->_M_val).second == 1) {
          uVar3 = ((local_68._M_cur)->_M_val).first;
          for (ppCVar7 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              ppCVar7 !=
              (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppCVar7 = ppCVar7 + 1) {
            pCVar2 = *ppCVar7;
            S = (longlong)((uint)(pCVar2->m_pPointS->super_CObject).m_Key & 0xffffff00);
            E = (longlong)((uint)(pCVar2->m_pPointE->super_CObject).m_Key & 0xffffff00);
            if ((uVar3 == S) || (uVar3 == E)) {
              DelWire(this,pCVar2,0);
              CWire::Delete(pCVar2);
              piVar6 = __gnu_cxx::
                       hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                       ::operator[]((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                                     *)&RedPoint._M_ht,&S);
              *piVar6 = *piVar6 + -1;
              piVar6 = __gnu_cxx::
                       hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                       ::operator[]((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                                     *)&RedPoint._M_ht,&E);
              *piVar6 = *piVar6 + -1;
              break;
            }
          }
          local_68 = __gnu_cxx::
                     hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                     ::begin(&RedPoint._M_ht);
        }
        else {
          __gnu_cxx::
          _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
          ::operator++(&local_68);
        }
      }
      iVar4 = this->m_iMinWL;
      iVar5 = GetLength(this,1,1);
      if (iVar4 < iVar5) {
        iVar4 = this->m_iMinWL;
      }
      else {
        iVar4 = GetLength(this,1,1);
      }
      this->m_iMinWL = iVar4;
      if ((this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __assert_fail("m_Wire.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                      ,0x200,"void CNet::Refine()");
      }
      __gnu_cxx::
      hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
      ::~hashtable(&RedPoint._M_ht);
    }
  }
  return;
}

Assistant:

void CNet::Refine()
{
	if(IsLocal())	return;
	if(!IsRouted())	return;

	SplitWire();

	hash_map<KEY, int>				RedPoint;
	hash_map<KEY, int>::iterator		itrp;

	vector<CWire*>::iterator itr,end;
	for(itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
	{
		CWire*	pWire	=	*itr;

		++RedPoint[pWire->m_pPointS->GetKey()&0xFFFFFF00];
		++RedPoint[pWire->m_pPointE->GetKey()&0xFFFFFF00];
	}

	for(int i=0;i<GetNumPin();++i)
		RedPoint.erase(GetPin(i)->GetKey()&0xFFFFFF00);

	for(itrp=RedPoint.begin();itrp!=RedPoint.end();)
	{
		if(itrp->second==1)	// dangling point [7/5/2006 thyeros]
		{
			KEY	P	=	itrp->first;
	
			for(itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
			{
				CWire*	pWire	=	*itr;

				KEY S	=	pWire->m_pPointS->GetKey()&0xFFFFFF00;
				KEY	E	=	pWire->m_pPointE->GetKey()&0xFFFFFF00;

				if(P==S||P==E)
				{
					DelWire(pWire);
					pWire->Delete();//SAFE_DEL(pWire);

					--RedPoint[S];
					--RedPoint[E];

					break;
				}
			}

			itrp=RedPoint.begin();
		}
		else
		{
			++itrp;
		}
	}

	m_iMinWL	=	MIN(m_iMinWL,GetLength(GET_MODE_STATE,STATE_WIRE_ROUTED));
//	m_iMinVia	=	MIN(m_iMinVia,GetNumVia());

	assert(m_Wire.size());
}